

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::AdvancedIterations::RelinkProgram(AdvancedIterations *this,GLuint index)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLchar *v [1];
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->m_po,index,"vs_in_data");
  v[0] = "data";
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,this->m_po,1,v,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_po);
  bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_po);
  return bVar1;
}

Assistant:

bool RelinkProgram(GLuint index)
	{
		glBindAttribLocation(m_po, index, "vs_in_data");
		/* setup XFB */
		{
			const GLchar* const v[1] = { "data" };
			glTransformFeedbackVaryings(m_po, 1, v, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_po);
		if (!CheckProgram(m_po))
			return false;
		return true;
	}